

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedDynamicMachine.hpp
# Opt level: O0

Source * __thiscall
Machine::TypedDynamicMachine<Sinclair::ZX8081::Machine>::get<Activity::Source>
          (TypedDynamicMachine<Sinclair::ZX8081::Machine> *this)

{
  pointer pMVar1;
  Source *local_20;
  TypedDynamicMachine<Sinclair::ZX8081::Machine> *this_local;
  
  pMVar1 = std::
           unique_ptr<Sinclair::ZX8081::Machine,_std::default_delete<Sinclair::ZX8081::Machine>_>::
           get(&this->machine_);
  if (pMVar1 == (pointer)0x0) {
    local_20 = (Source *)0x0;
  }
  else {
    local_20 = (Source *)
               __dynamic_cast(pMVar1,&Sinclair::ZX8081::Machine::typeinfo,
                              &Activity::Source::typeinfo,0xfffffffffffffffe);
  }
  return local_20;
}

Assistant:

Class *get() {
			return dynamic_cast<Class *>(machine_.get());

			// Note to self: the below is not [currently] used
			// because in practice TypedDynamicMachine is instantiated
			// with an abstract parent of the actual class.
			//
			// TODO: rethink type hiding here. I think I've boxed myself
			// into an uncomfortable corner.
//			if constexpr (std::is_base_of_v<Class, T>) {
//				return static_cast<Class *>(machine_.get());
//			} else {
//				return nullptr;
//			}
		}